

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VScaleAddMulti(N_Vector X,sunindextype param_2,int myid)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  int iVar8;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar6 = (undefined8 *)N_VCloneVectorArray(3,X);
  puVar7 = (undefined8 *)N_VCloneVectorArray(3,X);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  N_VConst(0,X);
  N_VConst(0,*puVar7);
  local_48 = 0x4000000000000000;
  dVar1 = get_time();
  iVar8 = 1;
  iVar3 = N_VScaleAddMulti(1,&local_48,X,puVar7,puVar7);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(1.0,(N_Vector)*puVar7,param_2);
    if (iVar3 != 0) goto LAB_0010673b;
    iVar8 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMulti Case 1a ");
    }
  }
  else {
LAB_0010673b:
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleAddMulti");
  }
  N_VConst(0,X);
  N_VConst(0,*puVar7);
  local_48 = 0x4000000000000000;
  N_VConst(0,*puVar6);
  dVar1 = get_time();
  iVar3 = N_VScaleAddMulti(1,&local_48,X,puVar7,puVar6);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(1.0,(N_Vector)*puVar6,param_2);
    if (iVar3 != 0) goto LAB_00106813;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMulti Case 1b ");
    }
  }
  else {
LAB_00106813:
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1b, Proc %d \n",(ulong)(uint)myid);
    iVar8 = iVar8 + 1;
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleAddMulti");
  }
  N_VConst(0,X);
  N_VConst(0,*puVar7);
  N_VConst(0,puVar7[1]);
  N_VConst(0,puVar7[2]);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0xc000000000000000;
  local_38 = 0x4000000000000000;
  dVar1 = get_time();
  iVar3 = N_VScaleAddMulti(3,&local_48,X,puVar7,puVar7);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(-1.0,(N_Vector)*puVar7,param_2);
    iVar4 = check_ans(0.0,(N_Vector)puVar7[1],param_2);
    iVar5 = check_ans(1.0,(N_Vector)puVar7[2],param_2);
    if (iVar5 + iVar4 + iVar3 != 0) goto LAB_00106961;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMulti Case 2a ");
    }
  }
  else {
LAB_00106961:
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2a, Proc %d \n",(ulong)(uint)myid);
    iVar8 = iVar8 + 1;
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleAddMulti");
  }
  N_VConst(0,X);
  N_VConst(0,*puVar7);
  N_VConst(0,puVar7[1]);
  N_VConst(0,puVar7[2]);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0xc000000000000000;
  local_38 = 0x4000000000000000;
  N_VConst(0,*puVar6);
  N_VConst(0,puVar6[1]);
  N_VConst(0,puVar6[2]);
  dVar1 = get_time();
  iVar3 = N_VScaleAddMulti(3,&local_48,X,puVar7,puVar6);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = check_ans(-1.0,(N_Vector)*puVar6,param_2);
    iVar4 = check_ans(0.0,(N_Vector)puVar6[1],param_2);
    iVar5 = check_ans(1.0,(N_Vector)puVar6[2],param_2);
    if (iVar5 + iVar4 + iVar3 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleAddMulti Case 2b ");
      }
      goto LAB_00106aee;
    }
  }
  printf(">>> FAILED test -- N_VScaleAddMulti Case 2b, Proc %d \n",myid);
  iVar8 = iVar8 + 1;
LAB_00106aee:
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VScaleAddMulti");
  }
  N_VDestroyVectorArray(puVar6,3);
  N_VDestroyVectorArray(puVar7,3);
  return iVar8;
}

Assistant:

int Test_N_VScaleAddMulti(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype avals[3];
  N_Vector *V, *Z;

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, X);
  V = N_VCloneVectorArray(3, X);

  /* initialize a values */
  avals[0] = ZERO;
  avals[1] = ZERO;
  avals[2] = ZERO;

  /*
   * Case 1a: V[0] = a[0] x + V[0], N_VLinearSum
   */

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(NEG_ONE, V[0]);

  /* set scaling factors */
  avals[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleAddMulti(1, avals, X, V, V);
  sync_device(X);
  stop_time = get_time();

  /* V[0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, V[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 1a \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 1b: Z[0] = a[0] x + V[0], N_VLinearSum
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X);
  N_VConst(NEG_ONE, V[0]);

  avals[0] = TWO;

  N_VConst(ZERO, Z[0]);

  start_time = get_time();
  ierr       = N_VScaleAddMulti(1, avals, X, V, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 1b \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 2a: V[i] = a[i] x + V[i], N_VScaleAddMulti
   */

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(NEG_TWO, V[0]);
  N_VConst(TWO, V[1]);
  N_VConst(NEG_ONE, V[2]);

  /* set scaling factors */
  avals[0] = ONE;
  avals[1] = NEG_TWO;
  avals[2] = TWO;

  start_time = get_time();
  ierr       = N_VScaleAddMulti(3, avals, X, V, V);
  sync_device(X);
  stop_time = get_time();

  /* V[i] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, V[0], local_length);
    failure += check_ans(ZERO, V[1], local_length);
    failure += check_ans(ONE, V[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 2a \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 2b: Z[i] = a[i] x + V[i], N_VScaleAddMulti
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X);
  N_VConst(NEG_TWO, V[0]);
  N_VConst(TWO, V[1]);
  N_VConst(NEG_ONE, V[2]);

  avals[0] = ONE;
  avals[1] = NEG_TWO;
  avals[2] = TWO;

  N_VConst(TWO, Z[0]);
  N_VConst(TWO, Z[1]);
  N_VConst(TWO, Z[2]);

  start_time = get_time();
  ierr       = N_VScaleAddMulti(3, avals, X, V, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[i] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0], local_length);
    failure += check_ans(ZERO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 2b \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(V, 3);

  return (fails);
}